

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall ON_Viewport::SetFrustumNearFar(ON_Viewport *this,double *box_min,double *box_max)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  double local_c8;
  double P [3];
  double local_a8;
  double camZ [3];
  double local_88;
  double camLoc [3];
  double d;
  double f;
  double n;
  int local_50;
  int k;
  int j;
  int i;
  double *box [2];
  bool local_29;
  double *pdStack_28;
  bool rc;
  double *box_max_local;
  double *box_min_local;
  ON_Viewport *this_local;
  
  local_29 = false;
  box_max_local = box_min;
  if (box_min == (double *)0x0) {
    box_max_local = box_max;
  }
  pdStack_28 = box_max;
  if (box_max == (double *)0x0) {
    pdStack_28 = box_max_local;
  }
  if (box_max_local == (double *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar2 = ON_IsValid(*box_max_local);
    if (((bVar2) && (bVar2 = ON_IsValid(box_max_local[1]), bVar2)) &&
       (bVar2 = ON_IsValid(box_max_local[2]), bVar2)) {
      bVar2 = ON_IsValid(*pdStack_28);
      if (((bVar2) && (bVar2 = ON_IsValid(pdStack_28[1]), bVar2)) &&
         (bVar2 = ON_IsValid(pdStack_28[2]), bVar2)) {
        if (((*pdStack_28 <= *box_max_local && *box_max_local != *pdStack_28) ||
            (pdStack_28[1] <= box_max_local[1] && box_max_local[1] != pdStack_28[1])) ||
           (pdStack_28[2] <= box_max_local[2] && box_max_local[2] != pdStack_28[2])) {
          this_local._7_1_ = false;
        }
        else {
          _j = box_max_local;
          box[0] = pdStack_28;
          bVar2 = GetCameraFrame(this,&local_88,(double *)0x0,(double *)0x0,&local_a8);
          if (bVar2) {
            d = -1.0;
            f = -1.0;
            for (k = 0; k < 2; k = k + 1) {
              for (local_50 = 0; local_50 < 2; local_50 = local_50 + 1) {
                for (n._4_4_ = 0; n._4_4_ < 2; n._4_4_ = n._4_4_ + 1) {
                  local_c8 = **(double **)(&j + (long)k * 2);
                  P[0] = *(double *)(*(long *)(&j + (long)local_50 * 2) + 8);
                  P[1] = *(double *)(*(long *)(&j + (long)n._4_4_ * 2) + 0x10);
                  camLoc[2] = clipDist(&local_88,&local_a8,&local_c8);
                  if ((((k != 0) || (local_50 != 0)) ||
                      (dVar3 = camLoc[2], dVar1 = camLoc[2], n._4_4_ != 0)) &&
                     ((dVar3 = d, dVar1 = camLoc[2], f <= camLoc[2] && (dVar1 = f, d < camLoc[2]))))
                  {
                    dVar3 = camLoc[2];
                  }
                  f = dVar1;
                  d = dVar3;
                }
              }
            }
            bVar2 = ON_IsValid(d);
            if ((!bVar2) || (bVar2 = ON_IsValid(f), !bVar2)) {
              return false;
            }
            if (d <= 0.0) {
              return false;
            }
            f = f * 0.9375;
            dVar3 = d * 1.0625;
            if (f <= 0.0) {
              f = this->m__MIN_NEAR_OVER_FAR * dVar3;
            }
            bVar2 = IsPerspectiveProjection(this);
            if (bVar2) {
              local_29 = SetFrustumNearFar(this,f,dVar3,this->m__MIN_NEAR_DIST,
                                           this->m__MIN_NEAR_OVER_FAR,(f + dVar3) * 0.5);
            }
            else {
              local_29 = SetFrustumNearFar(this,f,dVar3);
            }
          }
          this_local._7_1_ = local_29;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Viewport::SetFrustumNearFar( 
       const double* box_min,
       const double* box_max
       )
{
  bool rc = false;
  const double* box[2];
  int i,j,k;
  double n, f, d;
  double camLoc[3], camZ[3], P[3];

  if ( !box_min )
    box_min = box_max;
  if ( !box_max )
    box_max = box_min;
  if ( !box_min )
    return false;

  // 31 May 2007 Dale Lear RR 25980
  //    Add validation of box_min and box_max.
  if ( !ON_IsValid(box_min[0]) || !ON_IsValid(box_min[1]) || !ON_IsValid(box_min[2]) )
    return false;
  if ( !ON_IsValid(box_max[0]) || !ON_IsValid(box_max[1]) || !ON_IsValid(box_max[2]) )
    return false;
  if (    box_min[0] > box_max[0]
       || box_min[1] > box_max[1]
       || box_min[2] > box_max[2]
     )
  {
    return false;
  }
  box[0] = box_min;
  box[1] = box_max;

  if ( GetCameraFrame( camLoc, nullptr, nullptr, camZ ) ) {
    n = f = -1.0;
    for(i=0;i<2;i++)for(j=0;j<2;j++)for(k=0;k<2;k++) {
      P[0] = box[i][0];
      P[1] = box[j][1];
      P[2] = box[k][2];
      d = clipDist(camLoc,camZ,P);
      if (!i&&!j&&!k)
        n=f=d;
      else if ( d < n )
        n = d;
      else if ( d > f )
        f = d;
    }
    if ( !ON_IsValid(f) || !ON_IsValid(n) )
      return false;
    if ( f <= 0.0 )
      return false; // box is behind camera
    n *= 0.9375;
    f *= 1.0625;
    if ( n <= 0.0 )
      n = m__MIN_NEAR_OVER_FAR*f;
    if ( IsPerspectiveProjection() )
      rc = SetFrustumNearFar( n, f, m__MIN_NEAR_DIST, m__MIN_NEAR_OVER_FAR, 0.5*(n+f) );
    else
      rc = SetFrustumNearFar( n, f );
  }
  return rc;
}